

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Print
          (Printer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables,char *text)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  LogMessage *pLVar4;
  char *pcVar5;
  ulong uVar6;
  pointer ppVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_pair<unsigned_long,_unsigned_long>_>_>::value,_pair<iterator,_bool>_>
  _Var9;
  int local_178 [2];
  pair<int,_int> local_170;
  _Base_ptr local_168;
  undefined1 local_160;
  pair<unsigned_long,_unsigned_long> local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
  local_148;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  local_118;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  inserted;
  size_t begin;
  LogMessage local_f8;
  _Self local_c0;
  _Self local_b8;
  const_iterator iter;
  undefined1 local_a8 [8];
  string varname;
  LogFinisher local_7d;
  int endpos;
  LogMessage local_70;
  char *local_38;
  char *end;
  int local_28;
  int i;
  int pos;
  int size;
  char *text_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Printer *this_local;
  
  _pos = text;
  text_local = (char *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)this;
  sVar3 = strlen(text);
  i = (int)sVar3;
  local_28 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::clear(&this->substitutions_);
  for (end._4_4_ = 0; end._4_4_ < i; end._4_4_ = end._4_4_ + 1) {
    if (_pos[end._4_4_] == '\n') {
      WriteRaw(this,_pos + local_28,(end._4_4_ - local_28) + 1);
      local_28 = end._4_4_ + 1;
      this->at_start_of_line_ = true;
    }
    else if (_pos[end._4_4_] == this->variable_delimiter_) {
      WriteRaw(this,_pos + local_28,end._4_4_ - local_28);
      local_28 = end._4_4_ + 1;
      local_38 = strchr(_pos + local_28,(int)this->variable_delimiter_);
      if (local_38 == (char *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                   ,0x88);
        pLVar4 = internal::LogMessage::operator<<(&local_70," Unclosed variable name.");
        internal::LogFinisher::operator=(&local_7d,pLVar4);
        internal::LogMessage::~LogMessage(&local_70);
        local_38 = _pos + local_28;
      }
      varname.field_2._12_4_ = (int)local_38 - pos;
      pcVar5 = _pos + local_28;
      iVar2 = varname.field_2._12_4_ - local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_a8,pcVar5,(long)iVar2,(allocator *)((long)&iter._M_node + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)text_local,(key_type *)local_a8);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)text_local);
        bVar1 = std::operator==(&local_b8,&local_c0);
        if (bVar1) {
          internal::LogMessage::LogMessage
                    (&local_f8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                     ,0x95);
          pLVar4 = internal::LogMessage::operator<<(&local_f8," Undefined variable: ");
          pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)local_a8);
          internal::LogFinisher::operator=((LogFinisher *)((long)&begin + 7),pLVar4);
          internal::LogMessage::~LogMessage(&local_f8);
        }
        else {
          inserted._8_8_ = this->offset_;
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_b8);
          pcVar5 = (char *)std::__cxx11::string::data();
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_b8);
          iVar2 = std::__cxx11::string::size();
          WriteRaw(this,pcVar5,iVar2);
          pVar8 = std::make_pair<unsigned_long&,unsigned_long&>
                            ((unsigned_long *)&inserted.second,&this->offset_);
          local_158 = pVar8;
          std::make_pair<std::__cxx11::string&,std::pair<unsigned_long,unsigned_long>>
                    (&local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     &local_158);
          _Var9 = std::
                  map<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                  ::insert<std::pair<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
                            ((map<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                              *)&this->substitutions_,&local_148);
          local_168 = (_Base_ptr)_Var9.first._M_node;
          local_160 = _Var9.second;
          local_118._M_node = local_168;
          inserted.first._M_node._0_1_ = local_160;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
          ::~pair(&local_148);
          if (((byte)inserted.first._M_node & 1) == 0) {
            local_178[1] = 1;
            local_178[0] = 0;
            local_170 = std::make_pair<int,int>(local_178 + 1,local_178);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
                     ::operator->(&local_118);
            std::pair<unsigned_long,unsigned_long>::operator=
                      ((pair<unsigned_long,unsigned_long> *)&ppVar7->second,&local_170);
          }
        }
      }
      else {
        WriteRaw(this,&this->variable_delimiter_,1);
      }
      end._4_4_ = varname.field_2._12_4_;
      local_28 = varname.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  WriteRaw(this,_pos + local_28,i - local_28);
  return;
}

Assistant:

void Printer::Print(const std::map<string, string>& variables,
                    const char* text) {
  int size = strlen(text);
  int pos = 0;  // The number of bytes we've written so far.
  substitutions_.clear();

  for (int i = 0; i < size; i++) {
    if (text[i] == '\n') {
      // Saw newline.  If there is more text, we may need to insert an indent
      // here.  So, write what we have so far, including the '\n'.
      WriteRaw(text + pos, i - pos + 1);
      pos = i + 1;

      // Setting this true will cause the next WriteRaw() to insert an indent
      // first.
      at_start_of_line_ = true;

    } else if (text[i] == variable_delimiter_) {
      // Saw the start of a variable name.

      // Write what we have so far.
      WriteRaw(text + pos, i - pos);
      pos = i + 1;

      // Find closing delimiter.
      const char* end = strchr(text + pos, variable_delimiter_);
      if (end == NULL) {
        GOOGLE_LOG(DFATAL) << " Unclosed variable name.";
        end = text + pos;
      }
      int endpos = end - text;

      string varname(text + pos, endpos - pos);
      if (varname.empty()) {
        // Two delimiters in a row reduce to a literal delimiter character.
        WriteRaw(&variable_delimiter_, 1);
      } else {
        // Replace with the variable's value.
        std::map<string, string>::const_iterator iter = variables.find(varname);
        if (iter == variables.end()) {
          GOOGLE_LOG(DFATAL) << " Undefined variable: " << varname;
        } else {
          size_t begin = offset_;
          WriteRaw(iter->second.data(), iter->second.size());
          std::pair<std::map<string, std::pair<size_t, size_t> >::iterator,
                    bool>
              inserted = substitutions_.insert(
                  std::make_pair(varname, std::make_pair(begin, offset_)));
          if (!inserted.second) {
            // This variable was used multiple times.  Make its span have
            // negative length so we can detect it if it gets used in an
            // annotation.
            inserted.first->second = std::make_pair(1, 0);
          }
        }
      }

      // Advance past this variable.
      i = endpos;
      pos = endpos + 1;
    }
  }

  // Write the rest.
  WriteRaw(text + pos, size - pos);
}